

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void write_nal_unit_header_svc_extension(nal_svc_ext_t *nal_svc_ext,bs_t *b)

{
  bs_write_u1(b,(uint)nal_svc_ext->idr_flag);
  bs_write_u(b,6,(uint)nal_svc_ext->priority_id);
  bs_write_u1(b,(uint)nal_svc_ext->no_inter_layer_pred_flag);
  bs_write_u(b,3,(uint)nal_svc_ext->dependency_id);
  bs_write_u(b,4,(uint)nal_svc_ext->quality_id);
  bs_write_u(b,3,(uint)nal_svc_ext->temporal_id);
  bs_write_u1(b,(uint)nal_svc_ext->use_ref_base_pic_flag);
  bs_write_u1(b,(uint)nal_svc_ext->discardable_flag);
  bs_write_u1(b,(uint)nal_svc_ext->output_flag);
  bs_write_u(b,2,(uint)nal_svc_ext->reserved_three_2bits);
  return;
}

Assistant:

void write_nal_unit_header_svc_extension(nal_svc_ext_t* nal_svc_ext, bs_t* b)
{
    bs_write_u1(b, nal_svc_ext->idr_flag);
    bs_write_u(b, 6, nal_svc_ext->priority_id);
    bs_write_u1(b, nal_svc_ext->no_inter_layer_pred_flag);
    bs_write_u(b, 3, nal_svc_ext->dependency_id);
    bs_write_u(b, 4, nal_svc_ext->quality_id);
    bs_write_u(b, 3, nal_svc_ext->temporal_id);
    bs_write_u1(b, nal_svc_ext->use_ref_base_pic_flag);
    bs_write_u1(b, nal_svc_ext->discardable_flag);
    bs_write_u1(b, nal_svc_ext->output_flag);
    bs_write_u(b, 2, nal_svc_ext->reserved_three_2bits);
}